

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall wallet::WalletBatch::ErasePool(WalletBatch *this,int64_t nPool)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  pStack_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((string *)&pStack_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::POOL_abi_cxx11_);
  pStack_48.second = nPool;
  bVar1 = EraseIC<std::pair<std::__cxx11::string,long>>(this,&pStack_48);
  std::__cxx11::string::~string((string *)&pStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::ErasePool(int64_t nPool)
{
    return EraseIC(std::make_pair(DBKeys::POOL, nPool));
}